

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMeshSetPartitionId(FmsMesh mesh,FmsInt partition_id,FmsInt num_partitions)

{
  int iVar1;
  
  if (mesh == (FmsMesh)0x0) {
    iVar1 = 1;
  }
  else {
    if (partition_id < num_partitions) {
      mesh->partition_id = partition_id;
      mesh->num_partitions = num_partitions;
      return 0;
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int FmsMeshSetPartitionId(FmsMesh mesh, FmsInt partition_id,
                          FmsInt num_partitions) {
  if (!mesh) { E_RETURN(1); }
  // if (partition_id < 0) { E_RETURN(2); } // if FmsInt is signed
  if (partition_id >= num_partitions) { E_RETURN(2); }
  mesh->partition_id = partition_id;
  mesh->num_partitions = num_partitions;
  return 0;
}